

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall E64::stats_t::process_parameters(stats_t *this)

{
  uint uVar1;
  long in_RDI;
  double dVar2;
  
  *(char *)(in_RDI + 0x28) = *(char *)(in_RDI + 0x28) + '\x01';
  if (*(char *)(in_RDI + 0x28) == *(char *)(in_RDI + 0x29)) {
    *(undefined1 *)(in_RDI + 0x28) = 0;
    uVar1 = sdl2_get_queued_audio_size();
    *(double *)(in_RDI + 0x58) = (double)uVar1;
    *(double *)(in_RDI + 0x60) =
         *(double *)(in_RDI + 0x30) * *(double *)(in_RDI + 0x60) +
         (1.0 - *(double *)(in_RDI + 0x30)) * *(double *)(in_RDI + 0x58);
    *(double *)(in_RDI + 0x38) =
         (double)((uint)*(byte *)(in_RDI + 0x29) * 1000000) / (double)*(long *)(in_RDI + 0x18);
    *(double *)(in_RDI + 0x40) =
         *(double *)(in_RDI + 0x30) * *(double *)(in_RDI + 0x40) +
         (1.0 - *(double *)(in_RDI + 0x30)) * *(double *)(in_RDI + 0x38);
    *(double *)(in_RDI + 0x48) = (*(double *)(in_RDI + 0x38) * 198000.0) / 1000000.0;
    *(double *)(in_RDI + 0x50) =
         *(double *)(in_RDI + 0x30) * *(double *)(in_RDI + 0x50) +
         (1.0 - *(double *)(in_RDI + 0x30)) * *(double *)(in_RDI + 0x48);
    *(double *)(in_RDI + 0x68) =
         (double)(*(long *)(in_RDI + 0x20) / (long)(ulong)*(byte *)(in_RDI + 0x29));
    *(double *)(in_RDI + 0x70) =
         *(double *)(in_RDI + 0x30) * *(double *)(in_RDI + 0x70) +
         (1.0 - *(double *)(in_RDI + 0x30)) * *(double *)(in_RDI + 0x68);
    dVar2 = blitter_ic::fraction_busy(machine.blitter);
    *(double *)(in_RDI + 0x78) = dVar2;
    *(double *)(in_RDI + 0x80) =
         *(double *)(in_RDI + 0x30) * *(double *)(in_RDI + 0x80) +
         (1.0 - *(double *)(in_RDI + 0x30)) * 100.0 * *(double *)(in_RDI + 0x78);
    *(undefined8 *)(in_RDI + 0x20) = 0;
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  *(char *)(in_RDI + 0x2a) = *(char *)(in_RDI + 0x2a) + '\x01';
  if (*(char *)(in_RDI + 0x2a) == *(char *)(in_RDI + 0x2b)) {
    snprintf((char *)(in_RDI + 0x88),0x100,"%5.2fMHz  %5.2ffps  %5.2fms %4.1fkb %5.1f%% blit",
             *(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x40),
             *(double *)(in_RDI + 0x70) / 1000.0,*(double *)(in_RDI + 0x60) / 1024.0,
             *(undefined8 *)(in_RDI + 0x80));
    *(undefined1 *)(in_RDI + 0x2a) = 0;
  }
  return;
}

Assistant:

void E64::stats_t::process_parameters()
{
    framecounter++;
    if(framecounter == framecounter_interval)
    {
        framecounter = 0;
        
        audio_queue_size = E64::sdl2_get_queued_audio_size();
        smoothed_audio_queue_size = (alpha * smoothed_audio_queue_size) + ((1.0 - alpha) * audio_queue_size);

        // framerate is no. of frames in one measurement interval divided by the duration
        framerate = (double)(framecounter_interval * 1000000) / total_time;
        smoothed_framerate = (alpha * smoothed_framerate) + ((1.0 - alpha) * framerate);

        mhz = (double)(framerate * (CPU_CLOCK_SPEED / FPS) )/1000000;
        smoothed_mhz = (alpha * smoothed_mhz) + ((1.0 - alpha) * mhz);
        
        idle_per_frame = total_idle_time / (framecounter_interval);
        smoothed_idle_per_frame = (alpha * smoothed_idle_per_frame) + ((1.0 - alpha) * idle_per_frame);
        
        percentage_blitter = machine.blitter->fraction_busy();
        smoothed_percentage_blitter = (alpha * smoothed_percentage_blitter) + (100.0 * (1.0 - alpha) * percentage_blitter);
        
        total_time = total_idle_time = 0;
    }

    status_bar_framecounter++;
    if( status_bar_framecounter == status_bar_framecounter_interval )
    {
        snprintf(statistics_string, 256, "%5.2fMHz  %5.2ffps  %5.2fms %4.1fkb %5.1f%% blit", smoothed_mhz, smoothed_framerate, smoothed_idle_per_frame/1000, smoothed_audio_queue_size/1024, smoothed_percentage_blitter);
        status_bar_framecounter = 0;
    }
}